

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::ResourceDefinition::Node::~Node(Node *this)

{
  Node *this_local;
  
  ~Node(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

virtual					~Node				(void) { }